

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int createModule(sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                _func_void_void_ptr *xDestroy)

{
  int iVar1;
  void *pvVar2;
  undefined8 *data;
  char *pKey;
  char *zCopy;
  Module *pDel;
  Module *pMod;
  int nName;
  int rc;
  _func_void_void_ptr *xDestroy_local;
  void *pAux_local;
  sqlite3_module *pModule_local;
  char *zName_local;
  sqlite3 *db_local;
  
  pMod._4_4_ = 0;
  sqlite3_mutex_enter(db->mutex);
  iVar1 = sqlite3Strlen30(zName);
  pvVar2 = sqlite3HashFind(&db->aModule,zName,iVar1);
  if (pvVar2 == (void *)0x0) {
    data = (undefined8 *)sqlite3DbMallocRaw(db,iVar1 + 0x21);
    if (data != (undefined8 *)0x0) {
      pKey = (char *)(data + 4);
      memcpy(pKey,zName,(long)(iVar1 + 1));
      data[1] = pKey;
      *data = pModule;
      data[2] = pAux;
      data[3] = xDestroy;
      pvVar2 = sqlite3HashInsert(&db->aModule,pKey,iVar1,data);
      if (pvVar2 != (void *)0x0) {
        db->mallocFailed = '\x01';
        sqlite3DbFree(db,pvVar2);
      }
    }
  }
  else {
    pMod._4_4_ = sqlite3MisuseError(0x19396);
  }
  iVar1 = sqlite3ApiExit(db,pMod._4_4_);
  if ((iVar1 != 0) && (xDestroy != (_func_void_void_ptr *)0x0)) {
    (*xDestroy)(pAux);
  }
  sqlite3_mutex_leave(db->mutex);
  return iVar1;
}

Assistant:

static int createModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  int rc = SQLITE_OK;
  int nName;

  sqlite3_mutex_enter(db->mutex);
  nName = sqlite3Strlen30(zName);
  if( sqlite3HashFind(&db->aModule, zName, nName) ){
    rc = SQLITE_MISUSE_BKPT;
  }else{
    Module *pMod;
    pMod = (Module *)sqlite3DbMallocRaw(db, sizeof(Module) + nName + 1);
    if( pMod ){
      Module *pDel;
      char *zCopy = (char *)(&pMod[1]);
      memcpy(zCopy, zName, nName+1);
      pMod->zName = zCopy;
      pMod->pModule = pModule;
      pMod->pAux = pAux;
      pMod->xDestroy = xDestroy;
      pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,nName,(void*)pMod);
      assert( pDel==0 || pDel==pMod );
      if( pDel ){
        db->mallocFailed = 1;
        sqlite3DbFree(db, pDel);
      }
    }
  }
  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && xDestroy ) xDestroy(pAux);

  sqlite3_mutex_leave(db->mutex);
  return rc;
}